

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
writeDataTypeAttribute
          (UA_Server *server,UA_VariableNode *node,UA_NodeId *dataType,UA_NodeId *constraintDataType
          )

{
  UA_NodeId *dst;
  UA_Byte *pUVar1;
  size_t sVar2;
  UA_Boolean UVar3;
  UA_StatusCode UVar4;
  UA_DataValue *v;
  undefined1 local_c0 [8];
  UA_NodeId subtypeId;
  UA_DataValue value;
  
  if ((node->nodeClass == UA_NODECLASS_VARIABLETYPE) &&
     (UVar3 = UA_Node_hasSubTypeOrInstances((UA_Node *)node), UVar3)) {
    return 0x80020000;
  }
  local_c0._0_2_ = 0;
  stack0xffffffffffffff44 = 0x2d00000000;
  v = (UA_DataValue *)0x1;
  UVar3 = isNodeInTree(server->nodestore,dataType,constraintDataType,(UA_NodeId *)local_c0,1);
  UVar4 = 0x80740000;
  if (UVar3) {
    value.sourcePicoseconds = 0;
    value._74_6_ = 0;
    value.serverTimestamp = 0;
    value.status = 0;
    value._60_4_ = 0;
    value.sourceTimestamp = 0;
    value.value.arrayDimensionsSize = 0;
    value.value.arrayDimensions = (UA_UInt32 *)0x0;
    value.value.arrayLength = 0;
    value.value.data = (void *)0x0;
    value.value.type = (UA_DataType *)0x0;
    value.value.storageType = UA_VARIANT_DATA;
    value.value._12_4_ = 0;
    subtypeId.identifier.string.data = (UA_Byte *)0x0;
    value._0_8_ = 0;
    UVar4 = readValueAttributeComplete
                      ((UA_Server *)node,(UA_VariableNode *)0x3,UA_TIMESTAMPSTORETURN_SOURCE,
                       (UA_String *)((long)&subtypeId.identifier + 8),v);
    if (UVar4 == 0) {
      if (((ulong)subtypeId.identifier.string.data & 1) != 0) {
        UVar4 = typeCheckValue(server,dataType,node->valueRank,node->arrayDimensionsSize,
                               node->arrayDimensions,(UA_Variant *)&value,(UA_NumericRange *)0x0,
                               (UA_Variant *)0x0);
        deleteMembers_noInit((void *)((long)&subtypeId.identifier + 8),UA_TYPES + 0x16);
        value.sourcePicoseconds = 0;
        value._74_6_ = 0;
        value.serverTimestamp = 0;
        value.status = 0;
        value._60_4_ = 0;
        value.sourceTimestamp = 0;
        value.value.arrayDimensionsSize = 0;
        value.value.arrayDimensions = (UA_UInt32 *)0x0;
        value.value.arrayLength = 0;
        value.value.data = (void *)0x0;
        value.value.type = (UA_DataType *)0x0;
        value.value.storageType = UA_VARIANT_DATA;
        value.value._12_4_ = 0;
        subtypeId.identifier.string.data = (UA_Byte *)0x0;
        value._0_8_ = 0;
        if (UVar4 != 0) {
          return UVar4;
        }
      }
      dst = &node->dataType;
      pUVar1 = (node->dataType).identifier.string.data;
      value.serverPicoseconds = (node->dataType).namespaceIndex;
      value._90_2_ = *(undefined2 *)&(node->dataType).field_0x2;
      value._92_4_ = (node->dataType).identifierType;
      sVar2 = (node->dataType).identifier.string.length;
      UVar4 = UA_copy(dataType,dst,UA_TYPES + 0x10);
      if (UVar4 == 0) {
        deleteMembers_noInit(&value.serverPicoseconds,UA_TYPES + 0x10);
      }
      else {
        (node->dataType).identifier.string.data = pUVar1;
        dst->namespaceIndex = value.serverPicoseconds;
        *(undefined2 *)&dst->field_0x2 = value._90_2_;
        dst->identifierType = value._92_4_;
        (node->dataType).identifier.string.length = sVar2;
      }
    }
  }
  return UVar4;
}

Assistant:

UA_StatusCode
writeDataTypeAttribute(UA_Server *server, UA_VariableNode *node,
                       const UA_NodeId *dataType, const UA_NodeId *constraintDataType) {
    /* If this is a variabletype, there must be no instances or subtypes of it
       when we do the change */
    if(node->nodeClass == UA_NODECLASS_VARIABLETYPE &&
       UA_Node_hasSubTypeOrInstances((const UA_Node*)node))
        return UA_STATUSCODE_BADINTERNALERROR;

    /* Does the new type match the constraints of the variabletype? */
    UA_NodeId subtypeId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    if(!isNodeInTree(server->nodestore, dataType,
                     constraintDataType, &subtypeId, 1))
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* Check if the current value would match the new type */
    UA_DataValue value;
    UA_DataValue_init(&value);
    UA_StatusCode retval = readValueAttribute(server, node, &value);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    if(value.hasValue) {
        retval = typeCheckValue(server, dataType, node->valueRank,
                                node->arrayDimensionsSize, node->arrayDimensions,
                                &value.value, NULL, NULL);
        UA_DataValue_deleteMembers(&value);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_DEBUG(server->config.logger, UA_LOGCATEGORY_SERVER,
                         "The current value does not match the new data type");
            return retval;
        }
    }

    /* Replace the datatype nodeid */
    UA_NodeId dtCopy = node->dataType;
    retval = UA_NodeId_copy(dataType, &node->dataType);
    if(retval != UA_STATUSCODE_GOOD) {
        node->dataType = dtCopy;
        return retval;
    }
    UA_NodeId_deleteMembers(&dtCopy);
    return UA_STATUSCODE_GOOD;
}